

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtract_avx2.c
# Opt level: O2

void subtract32_avx2(int16_t *diff_ptr,uint8_t *src_ptr,uint8_t *pred_ptr)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  
  auVar1 = vlddqu_avx(*(undefined1 (*) [32])src_ptr);
  auVar2 = vlddqu_avx(*(undefined1 (*) [32])pred_ptr);
  auVar4 = vpunpcklbw_avx2(auVar1,auVar2);
  auVar2 = vpunpckhbw_avx2(auVar1,auVar2);
  auVar3._8_2_ = 0xff01;
  auVar3._0_8_ = 0xff01ff01ff01ff01;
  auVar3._10_2_ = 0xff01;
  auVar3._12_2_ = 0xff01;
  auVar3._14_2_ = 0xff01;
  auVar3._16_2_ = 0xff01;
  auVar3._18_2_ = 0xff01;
  auVar3._20_2_ = 0xff01;
  auVar3._22_2_ = 0xff01;
  auVar3._24_2_ = 0xff01;
  auVar3._26_2_ = 0xff01;
  auVar3._28_2_ = 0xff01;
  auVar3._30_2_ = 0xff01;
  auVar1 = vpmaddubsw_avx2(auVar4,auVar3);
  auVar2 = vpmaddubsw_avx2(auVar2,auVar3);
  auVar4._0_16_ = ZEXT116(0) * auVar2._0_16_ + ZEXT116(1) * auVar1._0_16_;
  auVar4._16_16_ = ZEXT116(0) * auVar1._16_16_ + ZEXT116(1) * auVar2._0_16_;
  *(undefined1 (*) [32])diff_ptr = auVar4;
  auVar1 = vperm2i128_avx2(auVar1,auVar2,0x31);
  *(undefined1 (*) [32])(diff_ptr + 0x10) = auVar1;
  return;
}

Assistant:

static inline void subtract32_avx2(int16_t *diff_ptr, const uint8_t *src_ptr,
                                   const uint8_t *pred_ptr) {
  __m256i s = _mm256_lddqu_si256((__m256i *)(src_ptr));
  __m256i p = _mm256_lddqu_si256((__m256i *)(pred_ptr));
  __m256i set_one_minusone = _mm256_set1_epi32((int)0xff01ff01);
  __m256i diff0 = _mm256_unpacklo_epi8(s, p);
  __m256i diff1 = _mm256_unpackhi_epi8(s, p);
  diff0 = _mm256_maddubs_epi16(diff0, set_one_minusone);
  diff1 = _mm256_maddubs_epi16(diff1, set_one_minusone);
  _mm256_store_si256((__m256i *)(diff_ptr),
                     _mm256_permute2x128_si256(diff0, diff1, 0x20));
  _mm256_store_si256((__m256i *)(diff_ptr + 16),
                     _mm256_permute2x128_si256(diff0, diff1, 0x31));
}